

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O3

int GetKeyFromName(char *name)

{
  int iVar1;
  long lVar2;
  char **ppcVar3;
  
  if ((*name == '#') && (name[1] != '\0')) {
    iVar1 = atoi(name + 1);
    return iVar1;
  }
  ppcVar3 = KeyNames;
  lVar2 = 0;
  do {
    if (*ppcVar3 != (char *)0x0) {
      iVar1 = strcasecmp(*ppcVar3,name);
      if (iVar1 == 0) goto LAB_0035071b;
    }
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 0x1c4);
  lVar2 = 0;
LAB_0035071b:
  return (int)lVar2;
}

Assistant:

static int GetKeyFromName (const char *name)
{
	int i;

	// Names of the form #xxx are translated to key xxx automatically
	if (name[0] == '#' && name[1] != 0)
	{
		return atoi (name + 1);
	}

	// Otherwise, we scan the KeyNames[] array for a matching name
	for (i = 0; i < NUM_KEYS; i++)
	{
		if (KeyNames[i] && !stricmp (KeyNames[i], name))
			return i;
	}
	return 0;
}